

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O1

void charls::transform_line_to_triplet<charls::transform_hp1<unsigned_char>::inverse,unsigned_char>
               (uchar *source,size_t pixel_stride_in,triplet<unsigned_char> *destination,
               size_t pixel_stride,inverse *transform)

{
  uchar uVar1;
  uchar uVar2;
  size_t sVar3;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  if (pixel_stride != 0) {
    sVar3 = 0;
    do {
      uVar1 = source[sVar3 + pixel_stride_in];
      uVar2 = source[sVar3];
      (destination->field_2).v3 = source[sVar3 + pixel_stride_in * 2] + uVar1 + 0x80;
      destination->field_0 =
           (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)(uVar2 + uVar1 + -0x80);
      destination->field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar1;
      sVar3 = sVar3 + 1;
      destination = destination + 1;
    } while (pixel_stride != sVar3);
  }
  return;
}

Assistant:

void transform_line_to_triplet(const PixelType* source, const size_t pixel_stride_in, triplet<PixelType>* destination,
                               const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    triplet<PixelType>* type_buffer = destination;

    for (size_t i{}; i < pixel_count; ++i)
    {
        type_buffer[i] = transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]);
    }
}